

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O2

void Kit_TruthSwapAdjacentVars_64bit(word *pInOut,int nVars,int iVar)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  size_t __n;
  undefined1 local_838 [2056];
  
  uVar6 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar6 = 1;
  }
  if (iVar < nVars + -1) {
    iVar5 = (int)uVar6;
    if (iVar < 5) {
      uVar4 = 0;
      if (iVar5 < 1) {
        uVar6 = 0;
      }
      for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        uVar1 = pInOut[uVar4];
        bVar3 = (byte)(1 << ((byte)iVar & 0x1f));
        pInOut[uVar4] =
             (uVar1 & Kit_TruthSwapAdjacentVars_64bit::PMasks[iVar][2]) >> (bVar3 & 0x3f) |
             (Kit_TruthSwapAdjacentVars_64bit::PMasks[iVar][1] & uVar1) << (bVar3 & 0x3f) |
             Kit_TruthSwapAdjacentVars_64bit::PMasks[iVar][0] & uVar1;
      }
    }
    else if (iVar == 5) {
      for (lVar2 = 0; lVar2 < iVar5; lVar2 = lVar2 + 2) {
        uVar6 = pInOut[lVar2 + 1];
        pInOut[lVar2 + 1] = (uVar6 << 0x20 ^ pInOut[lVar2]) >> 0x20 ^ uVar6;
        *(int *)((long)pInOut + lVar2 * 8 + 4) = (int)uVar6;
      }
    }
    else {
      bVar3 = (byte)iVar - 6;
      __n = (size_t)(8 << (bVar3 & 0x1f));
      for (lVar2 = (long)(2 << (bVar3 & 0x1f)); (int)lVar2 < iVar5;
          lVar2 = lVar2 + (4 << (bVar3 & 0x1f))) {
        memcpy(local_838,pInOut + (lVar2 - (1 << (bVar3 & 0x1f))),__n);
        memcpy(pInOut + (lVar2 - (1 << (bVar3 & 0x1f))),pInOut + lVar2,__n);
        memcpy(pInOut + lVar2,local_838,__n);
      }
    }
    return;
  }
  __assert_fail("iVar < nVars - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/lucky/luckySwap.c"
                ,0x9a,"void Kit_TruthSwapAdjacentVars_64bit(word *, int, int)");
}

Assistant:

void Kit_TruthSwapAdjacentVars_64bit( word * pInOut, int nVars, int iVar )
{
    int i, Step, Shift, SizeOfBlock;                   //
    word temp[256];                   // to make only pInOut possible
    static word PMasks[5][3] = {
        { ABC_CONST(0x9999999999999999), ABC_CONST(0x2222222222222222), ABC_CONST(0x4444444444444444) },
        { ABC_CONST(0xC3C3C3C3C3C3C3C3), ABC_CONST(0x0C0C0C0C0C0C0C0C), ABC_CONST(0x3030303030303030) },
        { ABC_CONST(0xF00FF00FF00FF00F), ABC_CONST(0x00F000F000F000F0), ABC_CONST(0x0F000F000F000F00) },
        { ABC_CONST(0xFF0000FFFF0000FF), ABC_CONST(0x0000FF000000FF00), ABC_CONST(0x00FF000000FF0000) },
        { ABC_CONST(0xFFFF00000000FFFF), ABC_CONST(0x00000000FFFF0000), ABC_CONST(0x0000FFFF00000000) }
    };
    int nWords = Kit_TruthWordNum_64bit( nVars ); 
    
    assert( iVar < nVars - 1 );
    if ( iVar < 5 )
    {
        Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pInOut[i] = (pInOut[i] & PMasks[iVar][0]) | ((pInOut[i] & PMasks[iVar][1]) << Shift) | ((pInOut[i] & PMasks[iVar][2]) >> Shift);
    }
    else if ( iVar > 5 )
    {
        Step = 1 << (iVar - 6);
        SizeOfBlock = sizeof(word)*Step;
        pInOut += 2*Step;
        for(i=2*Step; i<nWords; i+=4*Step)
        {           
            memcpy(temp,pInOut-Step,(size_t)SizeOfBlock);
            memcpy(pInOut-Step,pInOut,(size_t)SizeOfBlock);
            memcpy(pInOut,temp,(size_t)SizeOfBlock);
            pInOut += 4*Step;
        }
    }
    else // if ( iVar == 5 )
    {
        for ( i = 0; i < nWords; i += 2 )
        {
            temp[0] = pInOut[i+1] << 32;
            pInOut[i+1] ^= (temp[0] ^ pInOut[i]) >> 32;
            pInOut[i] = (pInOut[i] & 0x00000000FFFFFFFF) | temp[0];
            
        }
    }
}